

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP.h
# Opt level: O3

void __thiscall
ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor(TimedTextDescriptor *this)

{
  (this->EditRate).Numerator = 0;
  (this->EditRate).Denominator = 0;
  this->ContainerDuration = 0;
  (this->NamespaceName)._M_dataplus._M_p = (pointer)&(this->NamespaceName).field_2;
  (this->NamespaceName)._M_string_length = 0;
  (this->NamespaceName).field_2._M_local_buf[0] = '\0';
  (this->EncodingName)._M_dataplus._M_p = (pointer)&(this->EncodingName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->EncodingName,"UTF-8","");
  (this->ResourceList).
  super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->ResourceList;
  (this->ResourceList).
  super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->ResourceList;
  (this->ResourceList).
  super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
  ._M_impl._M_node._M_size = 0;
  (this->RFC5646LanguageTagList)._M_dataplus._M_p = (pointer)&(this->RFC5646LanguageTagList).field_2
  ;
  (this->RFC5646LanguageTagList)._M_string_length = 0;
  (this->RFC5646LanguageTagList).field_2._M_local_buf[0] = '\0';
  this->AssetID[0] = '\0';
  this->AssetID[1] = '\0';
  this->AssetID[2] = '\0';
  this->AssetID[3] = '\0';
  this->AssetID[4] = '\0';
  this->AssetID[5] = '\0';
  this->AssetID[6] = '\0';
  this->AssetID[7] = '\0';
  this->AssetID[8] = '\0';
  this->AssetID[9] = '\0';
  this->AssetID[10] = '\0';
  this->AssetID[0xb] = '\0';
  this->AssetID[0xc] = '\0';
  this->AssetID[0xd] = '\0';
  this->AssetID[0xe] = '\0';
  this->AssetID[0xf] = '\0';
  return;
}

Assistant:

TimedTextDescriptor() : ContainerDuration(0), EncodingName("UTF-8") { memset(AssetID, 0, UUIDlen); }